

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O0

void __thiscall json11::Json::Json(Json *this,array *values)

{
  vector<json11::Json,_std::allocator<json11::Json>_> local_28;
  array *values_local;
  Json *this_local;
  
  local_28.super__Vector_base<json11::Json,_std::allocator<json11::Json>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)values;
  values_local = (array *)this;
  std::make_shared<json11::JsonArray,std::vector<json11::Json,std::allocator<json11::Json>>>
            (&local_28);
  std::shared_ptr<json11::JsonValue>::shared_ptr<json11::JsonArray,void>
            (&this->m_ptr,(shared_ptr<json11::JsonArray> *)&local_28);
  std::shared_ptr<json11::JsonArray>::~shared_ptr((shared_ptr<json11::JsonArray> *)&local_28);
  return;
}

Assistant:

Json::Json(Json::array &&values)       : m_ptr(make_shared<JsonArray>(move(values))) {}